

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.hpp
# Opt level: O1

hugeint_t duckdb::TryAbsOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(hugeint_t input)

{
  bool bVar1;
  OutOfRangeException *this;
  size_type in_RSI;
  pointer in_RDI;
  hugeint_t hVar2;
  hugeint_t zero;
  string local_88;
  hugeint_t local_68;
  string local_50;
  hugeint_t local_30;
  
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0x8000000000000000;
  local_68.lower = (uint64_t)in_RDI;
  local_68.upper = in_RSI;
  bVar1 = hugeint_t::operator==(&local_68,(hugeint_t *)&local_88);
  if (!bVar1) {
    local_88._M_dataplus._M_p = (pointer)local_68.lower;
    local_88._M_string_length = local_68.upper;
    hugeint_t::hugeint_t(&local_30,0);
    bVar1 = hugeint_t::operator<((hugeint_t *)&local_88,&local_30);
    if (bVar1) {
      hVar2 = hugeint_t::operator-((hugeint_t *)&local_88);
    }
    else {
      hVar2.upper = local_88._M_string_length;
      hVar2.lower = (uint64_t)local_88._M_dataplus._M_p;
    }
    return hVar2;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Overflow on abs(%s)","");
  hugeint_t::ToString_abi_cxx11_(&local_50,&local_68);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(this,&local_88,&local_50);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline hugeint_t TryAbsOperator::Operation(hugeint_t input) {
	if (input == NumericLimits<hugeint_t>::Minimum()) {
		throw OutOfRangeException("Overflow on abs(%s)", input.ToString());
	}
	return AbsOperator::Operation<hugeint_t, hugeint_t>(input);
}